

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

double mjs::anon_unknown_37::date_helper::make_day(double year,double month,double day)

{
  bool bVar1;
  time_t tVar2;
  undefined1 local_70 [8];
  tm tm;
  int32_t d;
  int m;
  int y;
  double day_local;
  double month_local;
  double year_local;
  
  bVar1 = std::isfinite(year);
  if (((bVar1) && (bVar1 = std::isfinite(month), bVar1)) && (bVar1 = std::isfinite(day), bVar1)) {
    tm.tm_zone._4_4_ = (int)day;
    memset(local_70,0,0x38);
    tm.tm_mday = (int)year + (int)month / 0xc + -0x76c;
    tm.tm_min = tm.tm_zone._4_4_;
    tm.tm_hour = (int)month % 0xc;
    tVar2 = timegm((tm *)local_70);
    year_local = (double)tVar2 / 86400.0;
  }
  else {
    year_local = NAN;
  }
  return year_local;
}

Assistant:

static double make_day(double year, double month, double day) {
        if (!std::isfinite(year) || !std::isfinite(month) || !std::isfinite(day)) {
            return NAN;
        }
        const auto y = static_cast<int32_t>(year) + static_cast<int32_t>(month)/12;
        const auto m = static_cast<int32_t>(month) % 12;
        const auto d = static_cast<int32_t>(day);
        // non-standard :/
        std::tm tm;
        std::memset(&tm, 0, sizeof(tm));
        tm.tm_year = y - 1900;
        tm.tm_mon = m;
        tm.tm_mday = d;
        return static_cast<double>(_mkgmtime(&tm)) / 86400;
    }